

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O2

void __thiscall
QtMWidgets::AbstractScrollArea::resizeEvent(AbstractScrollArea *this,QResizeEvent *e)

{
  QStyleOption opt;
  
  QStyleOption::QStyleOption(&opt,1,0);
  QStyleOption::initFrom((QWidget *)&opt);
  AbstractScrollAreaPrivate::layoutChildren((this->d).d,&opt);
  AbstractScrollAreaPrivate::normalizePosition((this->d).d);
  AbstractScrollAreaPrivate::calcIndicators((this->d).d);
  QWidget::update();
  e[0xc] = (QResizeEvent)0x1;
  QStyleOption::~QStyleOption(&opt);
  return;
}

Assistant:

void
AbstractScrollArea::resizeEvent( QResizeEvent * e )
{
	QStyleOption opt;
	opt.initFrom( this );

	d->layoutChildren( opt );
	d->normalizePosition();
	d->calcIndicators();

	update();

	e->accept();
}